

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qkeysequenceedit.cpp
# Opt level: O3

void QKeySequenceEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayData *pQVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  Data *count;
  QArrayDataPointer<QKeyCombination> *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QKeyCombination> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
        return;
      }
      break;
    case 1:
      local_38.ptr = (QKeyCombination *)_a[1];
      local_38.d = (Data *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,1,&local_38.d);
      goto switchD_0040cf96_caseD_3;
    case 2:
      pQVar5 = (QArrayDataPointer<QKeyCombination> *)_a[1];
switchD_0040cffc_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setKeySequence((QKeySequenceEdit *)_o,(QKeySequence *)pQVar5);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clear((QKeySequenceEdit *)_o);
        return;
      }
      break;
    case 4:
      count = *_a[1];
LAB_0040d190:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximumSequenceLength((QKeySequenceEdit *)_o,(qsizetype)count);
        return;
      }
      break;
    default:
      goto switchD_0040cf96_caseD_3;
    }
    goto LAB_0040d227;
  case ReadProperty:
    if ((uint)_id < 4) {
      pQVar5 = (QArrayDataPointer<QKeyCombination> *)*_a;
      switch(_id) {
      case 0:
        QKeySequence::QKeySequence
                  ((QKeySequence *)&local_38,(QKeySequence *)(*(long *)(_o + 8) + 0x260));
        pQVar1 = &pQVar5->d->super_QArrayData;
        pQVar5->d = local_38.d;
        local_38.d = (Data *)pQVar1;
        QKeySequence::~QKeySequence((QKeySequence *)&local_38);
        break;
      case 1:
        bVar4 = QLineEdit::isClearButtonEnabled(*(QLineEdit **)(*(long *)(_o + 8) + 600));
        *(bool *)&pQVar5->d = bVar4;
        break;
      case 2:
        pQVar5->d = (Data *)(long)*(int *)(*(long *)(_o + 8) + 0x26c);
        break;
      case 3:
        lVar3 = *(long *)(_o + 8);
        local_38.d = *(Data **)(lVar3 + 0x288);
        local_38.ptr = *(QKeyCombination **)(lVar3 + 0x290);
        local_38.size = *(qsizetype *)(lVar3 + 0x298);
        if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QArrayDataPointer<QKeyCombination>::operator=(pQVar5,&local_38);
        if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_38.d)->super_QArrayData,4,0x10);
          }
        }
      }
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      pQVar5 = (QArrayDataPointer<QKeyCombination> *)*_a;
      switch(_id) {
      case 0:
        goto switchD_0040cffc_caseD_0;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QLineEdit::setClearButtonEnabled
                    (*(QLineEdit **)(*(long *)(_o + 8) + 600),*(bool *)&pQVar5->d);
          return;
        }
        break;
      case 2:
        count = pQVar5->d;
        goto LAB_0040d190;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QArrayDataPointer<QKeyCombination>::operator=
                    ((QArrayDataPointer<QKeyCombination> *)(*(long *)(_o + 8) + 0x288),pQVar5);
          return;
        }
      }
      goto LAB_0040d227;
    }
    break;
  case IndexOfMethod:
    pcVar2 = *_a[1];
    lVar3 = *(long *)((long)_a[1] + 8);
    if (pcVar2 == editingFinished && lVar3 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar2 == keySequenceChanged && lVar3 == 0) {
      *(undefined4 *)*_a = 1;
    }
  }
switchD_0040cf96_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0040d227:
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QKeySequenceEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editingFinished(); break;
        case 1: _t->keySequenceChanged((*reinterpret_cast< std::add_pointer_t<QKeySequence>>(_a[1]))); break;
        case 2: _t->setKeySequence((*reinterpret_cast< std::add_pointer_t<QKeySequence>>(_a[1]))); break;
        case 3: _t->clear(); break;
        case 4: _t->setMaximumSequenceLength((*reinterpret_cast< std::add_pointer_t<qsizetype>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QKeySequenceEdit::*)()>(_a, &QKeySequenceEdit::editingFinished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QKeySequenceEdit::*)(const QKeySequence & )>(_a, &QKeySequenceEdit::keySequenceChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QKeySequence*>(_v) = _t->keySequence(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isClearButtonEnabled(); break;
        case 2: *reinterpret_cast<qsizetype*>(_v) = _t->maximumSequenceLength(); break;
        case 3: *reinterpret_cast<QList<QKeyCombination>*>(_v) = _t->finishingKeyCombinations(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setKeySequence(*reinterpret_cast<QKeySequence*>(_v)); break;
        case 1: _t->setClearButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setMaximumSequenceLength(*reinterpret_cast<qsizetype*>(_v)); break;
        case 3: _t->setFinishingKeyCombinations(*reinterpret_cast<QList<QKeyCombination>*>(_v)); break;
        default: break;
        }
    }
}